

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall
Catch::Session::applyCommandLine(Session *this,int argc,char **argv,DoWhat unusedOptionBehaviour)

{
  Colour colourGuard;
  exception *ex;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> local_48;
  DoWhat local_2c;
  char **ppcStack_28;
  DoWhat unusedOptionBehaviour_local;
  char **argv_local;
  Session *pSStack_18;
  int argc_local;
  Session *this_local;
  
  local_2c = unusedOptionBehaviour;
  ppcStack_28 = argv;
  argv_local._4_4_ = argc;
  pSStack_18 = this;
  Clara::CommandLine<Catch::ConfigData>::parseInto
            (&local_48,&this->m_cli,argc,argv,&this->m_configData);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::operator=
            (&this->m_unusedTokens,&local_48);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector(&local_48);
  if (local_2c == Fail) {
    enforceNoUsedTokens(this);
  }
  if (((this->m_configData).showHelp & 1U) != 0) {
    showHelp(this,&(this->m_configData).processName);
  }
  Ptr<Catch::Config>::reset(&this->m_config);
  return 0;
}

Assistant:

int applyCommandLine( int argc, char* const argv[], OnUnusedOptions::DoWhat unusedOptionBehaviour = OnUnusedOptions::Fail ) {
            try {
                m_unusedTokens = m_cli.parseInto( argc, argv, m_configData );
                if( unusedOptionBehaviour == OnUnusedOptions::Fail )
                    enforceNoUsedTokens();
                if( m_configData.showHelp )
                    showHelp( m_configData.processName );
                m_config.reset();
            }
            catch( std::exception& ex ) {
                {
                    Colour colourGuard( Colour::Red );
                    std::cerr   << "\nError in input:\n"
                                << Text( ex.what(), TextAttributes().setIndent(2) )
                                << "\n\n";
                }
                m_cli.usage( std::cout, m_configData.processName );
                return (std::numeric_limits<int>::max)();
            }
            return 0;
        }